

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

bool __thiscall cmSourceFile::TryFullPath(cmSourceFile *this,string *path,string *ext)

{
  bool bVar1;
  string tryPath;
  char *local_38 [4];
  
  std::__cxx11::string::string((string *)local_38,(string *)path);
  if (ext->_M_string_length != 0) {
    std::__cxx11::string::append((char *)local_38);
    std::__cxx11::string::append((string *)local_38);
  }
  bVar1 = cmsys::SystemTools::FileExists(local_38[0]);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)&this->FullPath);
  }
  std::__cxx11::string::~string((string *)local_38);
  return bVar1;
}

Assistant:

bool cmSourceFile::TryFullPath(const std::string& path,
                               const std::string& ext)
{
  std::string tryPath = path;
  if(!ext.empty())
    {
    tryPath += ".";
    tryPath += ext;
    }
  if(cmSystemTools::FileExists(tryPath.c_str()))
    {
    this->FullPath = tryPath;
    return true;
    }
  return false;
}